

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_message.c
# Opt level: O3

IOTHUB_MESSAGE_RESULT
IoTHubMessage_GetByteArray(IOTHUB_MESSAGE_HANDLE iotHubMessageHandle,uchar **buffer,size_t *size)

{
  LOGGER_LOG p_Var1;
  uchar *puVar2;
  size_t sVar3;
  char *pcVar4;
  
  if ((buffer == (uchar **)0x0 || iotHubMessageHandle == (IOTHUB_MESSAGE_HANDLE)0x0) ||
      size == (size_t *)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                ,"IoTHubMessage_GetByteArray",0x1d2,1,
                "invalid parameter (NULL) to IoTHubMessage_GetByteArray IOTHUB_MESSAGE_HANDLE iotHubMessageHandle=%p, const unsigned char** buffer=%p, size_t* size=%p"
                ,iotHubMessageHandle,buffer,size);
      return IOTHUB_MESSAGE_INVALID_ARG;
    }
  }
  else {
    if (iotHubMessageHandle->contentType == IOTHUBMESSAGE_BYTEARRAY) {
      puVar2 = BUFFER_u_char((iotHubMessageHandle->value).byteArray);
      *buffer = puVar2;
      sVar3 = BUFFER_length((iotHubMessageHandle->value).byteArray);
      *size = sVar3;
      return IOTHUB_MESSAGE_OK;
    }
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      if ((ulong)iotHubMessageHandle->contentType < 3) {
        pcVar4 = IOTHUBMESSAGE_CONTENT_TYPEStringStorage[iotHubMessageHandle->contentType];
      }
      else {
        pcVar4 = "NULL";
      }
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                ,"IoTHubMessage_GetByteArray",0x1db,1,"invalid type of message %s",pcVar4);
      return IOTHUB_MESSAGE_INVALID_ARG;
    }
  }
  return IOTHUB_MESSAGE_INVALID_ARG;
}

Assistant:

IOTHUB_MESSAGE_RESULT IoTHubMessage_GetByteArray(IOTHUB_MESSAGE_HANDLE iotHubMessageHandle, const unsigned char** buffer, size_t* size)
{
    IOTHUB_MESSAGE_RESULT result;
    if (
        (iotHubMessageHandle == NULL) ||
        (buffer == NULL) ||
        (size == NULL)
        )
    {
        LogError("invalid parameter (NULL) to IoTHubMessage_GetByteArray IOTHUB_MESSAGE_HANDLE iotHubMessageHandle=%p, const unsigned char** buffer=%p, size_t* size=%p", iotHubMessageHandle, buffer, size);
        result = IOTHUB_MESSAGE_INVALID_ARG;
    }
    else
    {
        IOTHUB_MESSAGE_HANDLE_DATA* handleData = iotHubMessageHandle;
        if (handleData->contentType != IOTHUBMESSAGE_BYTEARRAY)
        {
            result = IOTHUB_MESSAGE_INVALID_ARG;
            LogError("invalid type of message %s", MU_ENUM_TO_STRING(IOTHUBMESSAGE_CONTENT_TYPE, handleData->contentType));
        }
        else
        {
            *buffer = BUFFER_u_char(handleData->value.byteArray);
            *size = BUFFER_length(handleData->value.byteArray);
            result = IOTHUB_MESSAGE_OK;
        }
    }
    return result;
}